

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_wraith.cpp
# Opt level: O3

int AF_A_WraithRaise(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  FState *newstate;
  PClass *pPVar5;
  uint uVar6;
  AActor *actor;
  VMValue *pVVar7;
  char *__assertion;
  bool bVar8;
  bool bVar9;
  FName local_30;
  FName local_2c;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005ebf9a;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    actor = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (actor == (AActor *)0x0) {
LAB_005ebe24:
        actor = (AActor *)0x0;
        pVVar7 = param;
        uVar6 = numparam;
      }
      else {
        pPVar4 = (actor->super_DThinker).super_DObject.Class;
        if (pPVar4 == (PClass *)0x0) {
          iVar3 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
          pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
          (actor->super_DThinker).super_DObject.Class = pPVar4;
        }
        bVar8 = pPVar4 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar8;
        bVar9 = pPVar4 == pPVar5;
        if (!bVar9 && !bVar8) {
          do {
            pPVar4 = pPVar4->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar4 != (PClass *)0x0);
            if (pPVar4 == pPVar5) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        pVVar7 = (VMValue *)(ulong)(bVar9 || bVar8);
        uVar6 = (uint)bVar8;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005ebf9a;
        }
      }
      pPVar5 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005ebee4;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005ebf8a;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar4 = (PClass *)puVar2[1];
            if (pPVar4 == (PClass *)0x0) {
              pPVar4 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar7,uVar6,ret);
              puVar2[1] = pPVar4;
            }
            bVar8 = pPVar4 != (PClass *)0x0;
            if (pPVar4 != pPVar5 && bVar8) {
              do {
                pPVar4 = pPVar4->ParentClass;
                bVar8 = pPVar4 != (PClass *)0x0;
                if (pPVar4 == pPVar5) break;
              } while (pPVar4 != (PClass *)0x0);
            }
            if (!bVar8) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005ebf9a;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005ebf8a;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005ebee4:
        bVar8 = A_RaiseMobj(actor,2.0);
        if (bVar8) {
          (actor->flags3).Value = (actor->flags3).Value & 0xfffffddf;
          local_30.Index = FName::NameManager::FindName(&FName::NameData,"Chase",false);
          newstate = AActor::FindState(actor,&local_30);
          AActor::SetState(actor,newstate,false);
          local_2c.Index = FName::NameManager::FindName(&FName::NameData,"Wraith",true);
          pPVar5 = PClass::FindClass(&local_2c);
          actor->PainChance = *(SWORD *)(pPVar5->Defaults + 0x3bc);
        }
        P_SpawnDirt(actor,actor->radius);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005ebf9a;
    }
    if (actor == (AActor *)0x0) goto LAB_005ebe24;
  }
LAB_005ebf8a:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005ebf9a:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                ,0x42,"int AF_A_WraithRaise(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WraithRaise)
{
	PARAM_ACTION_PROLOGUE;

	if (A_RaiseMobj (self, 2))
	{
		// Reached it's target height
		// [RH] Once a buried wraith is fully raised, it should be
		// morphable, right?
		self->flags3 &= ~(MF3_DONTMORPH|MF3_SPECIALFLOORCLIP);
		self->SetState (self->FindState("Chase"));
		// [RH] Reset PainChance to a normal wraith's.
		self->PainChance = GetDefaultByName ("Wraith")->PainChance;
	}

	P_SpawnDirt (self, self->radius);
	return 0;
}